

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

HdlcByte * __thiscall
HdlcAnalyzer::ByteAsyncReadByte(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  pointer *ppuVar1;
  bool bVar2;
  uchar uVar3;
  U64 UVar4;
  U64 UVar5;
  iterator iVar6;
  U8 UVar7;
  Frame frame;
  U64 local_50;
  U64 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined2 local_30;
  
  ByteAsyncReadByte_(__return_storage_ptr__,this);
  bVar2 = this->mReadingFrame;
  uVar3 = __return_storage_ptr__->value;
  if ((uVar3 == '~' & bVar2) == 1) {
    this->mFoundEndFlag = true;
  }
  if ((uVar3 == '}' & bVar2) == 1) {
    UVar4 = __return_storage_ptr__->startSample;
    ByteAsyncReadByte_(__return_storage_ptr__,this);
    if (__return_storage_ptr__->value == '~') {
      UVar5 = __return_storage_ptr__->endSample;
      Frame::Frame((Frame *)&local_50);
      local_30 = 7;
      local_40 = 0;
      uStack_38 = 0;
      *(undefined8 *)&this->field_0xa8 = 0;
      *(undefined8 *)&this->field_0xb0 = 0;
      *(undefined2 *)&this->field_0xb8 = 7;
      *(U64 *)&this->mAbtFrame = UVar4;
      *(U64 *)&this->field_0xa0 = UVar5;
      local_50 = UVar4;
      local_48 = UVar5;
      Frame::~Frame((Frame *)&local_50);
      this->mAbortFrame = true;
    }
    else {
      UVar7 = HdlcAnalyzerSettings::Bit5Inv(__return_storage_ptr__->value);
      local_50 = CONCAT71(local_50._1_7_,UVar7);
      iVar6._M_current =
           (this->mCurrentFrameBytes).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->mCurrentFrameBytes).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->mCurrentFrameBytes,
                   iVar6,(uchar *)&local_50);
      }
      else {
        *iVar6._M_current = UVar7;
        ppuVar1 = &(this->mCurrentFrameBytes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      __return_storage_ptr__->startSample = UVar4;
      __return_storage_ptr__->escaped = true;
    }
  }
  else if ((bVar2 & uVar3 != '~') == 1) {
    iVar6._M_current =
         (this->mCurrentFrameBytes).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->mCurrentFrameBytes,
                 iVar6,&__return_storage_ptr__->value);
    }
    else {
      *iVar6._M_current = uVar3;
      ppuVar1 = &(this->mCurrentFrameBytes).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ByteAsyncReadByte()
{
    HdlcByte ret = ByteAsyncReadByte_();

    if( mReadingFrame && ( ret.value == HDLC_FLAG_VALUE ) )
    {
        mFoundEndFlag = true;
    }

    // Check for escape character
    if( mReadingFrame && ( ret.value == HDLC_ESCAPE_SEQ_VALUE ) ) // escape byte read
    {
        U64 startSampleEsc = ret.startSample;
        ret = ByteAsyncReadByte_();

        if( ret.value == HDLC_FLAG_VALUE ) // abort sequence = ESCAPE_BYTE + FLAG_BYTE (0x7D-0x7E)
        {
            // Create "Abort Frame" frame
            mAbtFrame = CreateFrame( HDLC_ABORT_SEQ, startSampleEsc, ret.endSample );
            mAbortFrame = true;
            return ret;
        }
        else
        {
            // Real data: with the bit-5 inverted (that's what we use for the crc)
            U8 complimented = HdlcAnalyzerSettings::Bit5Inv( ret.value );
            mCurrentFrameBytes.push_back( complimented );
            // ret.value = complimented;
            ret.startSample = startSampleEsc;
            ret.escaped = true;
            return ret;
        }
    }

    if( mReadingFrame && ( ret.value != HDLC_FLAG_VALUE ) )
    {
        mCurrentFrameBytes.push_back( ret.value );
    }

    return ret;
}